

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyTypeObject * pybind11::detail::make_static_property_type(void)

{
  int iVar1;
  _object *ptr;
  handle hVar2;
  handle *this;
  PyObject *pPVar3;
  handle *this_00;
  PyTypeObject *reason;
  PyTypeObject *type;
  PyHeapTypeObject *heap_type;
  object name_obj;
  char *name;
  handle *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  handle in_stack_ffffffffffffffb0;
  handle local_40;
  PyTypeObject *local_38;
  PyTypeObject *local_20;
  handle local_18 [2];
  char *local_8;
  
  local_8 = "pybind11_static_property";
  ptr = (_object *)PyUnicode_FromString();
  pybind11::handle::handle<_object_*,_0>(local_18,ptr);
  hVar2.m_ptr._4_4_ = in_stack_ffffffffffffff8c;
  hVar2.m_ptr._0_4_ = in_stack_ffffffffffffff88;
  reinterpret_steal<pybind11::object>(hVar2);
  hVar2.m_ptr = (PyObject *)(*_MPI_Iprobe)(&PyType_Type,0);
  local_20 = (PyTypeObject *)hVar2.m_ptr;
  if ((PyTypeObject *)hVar2.m_ptr == (PyTypeObject *)0x0) {
    pybind11_fail(in_stack_ffffffffffffff90);
  }
  this = pybind11::handle::inc_ref(in_stack_ffffffffffffff80);
  pPVar3 = pybind11::handle::ptr(this);
  local_20[2].tp_basicsize = (Py_ssize_t)pPVar3;
  this_00 = pybind11::handle::inc_ref(in_stack_ffffffffffffff80);
  pPVar3 = pybind11::handle::ptr(this_00);
  local_20[2].tp_dealloc = (destructor)pPVar3;
  local_38 = local_20;
  local_20->tp_name = "pybind11_static_property";
  reason = type_incref((PyTypeObject *)0x2a45df);
  local_38->tp_base = reason;
  local_38->tp_flags = 0x600;
  local_38->tp_descr_get = pybind11_static_get;
  local_38->tp_descr_set = pybind11_static_set;
  iVar1 = PyType_Ready(local_38);
  if (iVar1 < 0) {
    pybind11_fail((char *)reason);
  }
  pybind11::handle::handle<_object_*,_0>(&local_40,(_object *)local_38);
  pybind11::str::str((str *)in_stack_ffffffffffffffb0.m_ptr,(char *)hVar2.m_ptr);
  setattr(in_stack_ffffffffffffffb0,(char *)this,hVar2);
  pybind11::str::~str((str *)0x2a46a4);
  object::~object((object *)0x2a46b8);
  return local_38;
}

Assistant:

inline PyTypeObject *make_static_property_type() {
    constexpr auto *name = "pybind11_static_property";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type) {
        pybind11_fail("make_static_property_type(): error allocating type!");
    }

    heap_type->ht_name = name_obj.inc_ref().ptr();
#    ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#    endif

    auto *type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyProperty_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
    type->tp_descr_get = pybind11_static_get;
    type->tp_descr_set = pybind11_static_set;

    if (PyType_Ready(type) < 0) {
        pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");
    }

#    if PY_VERSION_HEX >= 0x030C0000
    // PRE 3.12 FEATURE FREEZE. PLEASE REVIEW AFTER FREEZE.
    // Since Python-3.12 property-derived types are required to
    // have dynamic attributes (to set `__doc__`)
    enable_dynamic_attributes(heap_type);
#    endif

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}